

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O3

Float pbrt::BeamDiffusionMS(Float sigma_s,Float sigma_a,Float g,Float eta,Float r)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  int i;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [64];
  undefined1 auVar22 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  float fVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM18 [16];
  undefined4 local_28;
  undefined4 local_18;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar26._4_60_ = in_register_00001244;
  auVar26._0_4_ = sigma_a;
  fVar4 = (1.0 - g) * sigma_s;
  fVar3 = fVar4 + sigma_a;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)fVar4),auVar26._0_16_,ZEXT416(0x40000000));
  fVar18 = auVar21._0_4_ / (fVar3 * fVar3 * 3.0);
  auVar21._0_4_ = sigma_a / fVar18;
  auVar21._4_12_ = in_register_00001244._0_12_;
  auVar25._0_12_ = ZEXT412(0);
  auVar25._12_4_ = 0;
  auVar21 = vmaxss_avx(auVar21,auVar25);
  auVar21 = vsqrtss_avx(auVar21,auVar21);
  FVar19 = FresnelMoment1(eta);
  auVar23._0_4_ = FresnelMoment2(eta);
  auVar23._4_60_ = extraout_var;
  iVar10 = 0;
  auVar32 = SUB6416(ZEXT464(0x3f800000),0);
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar23._0_16_,auVar32);
  auVar25 = vfmadd132ss_fma(auVar23._0_16_,auVar32,ZEXT416(0xc0400000));
  auVar32 = vfmadd213ss_fma(ZEXT416((uint)FVar19),SUB6416(ZEXT464(0xc0000000),0),auVar32);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar14 = vxorps_avx512vl(auVar21,auVar14);
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  do {
    auVar15 = vcvtsi2ss_avx512f(in_XMM18,iVar10);
    auVar24._0_4_ = logf((auVar15._0_4_ + 0.5) / -100.0 + 1.0);
    auVar24._4_60_ = extraout_var_00;
    auVar15._8_4_ = 0x80000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar15._12_4_ = 0x80000000;
    auVar15 = vxorps_avx512vl(auVar24._0_16_,auVar15);
    local_18 = auVar14._0_4_;
    fVar6 = INFINITY;
    auVar27._0_4_ = auVar15._0_4_ / fVar3;
    auVar27._4_12_ = auVar15._4_12_;
    auVar17 = vfmsub231ss_fma(auVar27,SUB6416(ZEXT464(0x40000000),0),
                              ZEXT416((uint)((fVar18 * -2.0 * auVar7._0_4_) / auVar32._0_4_)));
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),ZEXT416((uint)r),
                              ZEXT416((uint)r));
    auVar5 = vsqrtss_avx(auVar15,auVar15);
    fVar20 = auVar5._0_4_;
    fVar11 = local_18 * fVar20 * 1.442695;
    auVar15 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
    fVar11 = fVar11 - auVar15._0_4_;
    auVar34 = SUB6416(ZEXT464(0x3da00ac9),0);
    auVar35 = SUB6416(ZEXT464(0x3e679a0b),0);
    auVar16 = vfmadd213ss_fma(auVar34,ZEXT416((uint)fVar11),auVar35);
    auVar16 = vfmadd213ss_avx512f(auVar16,ZEXT416((uint)fVar11),ZEXT416(0x3f321004));
    auVar33 = SUB6416(ZEXT464(0x3f800000),0);
    auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)fVar11),auVar33);
    uVar29 = auVar16._0_4_;
    iVar1 = (int)auVar15._0_4_ + -0x7f + (uVar29 >> 0x17);
    fVar11 = 0.0;
    if ((-0x7f < iVar1) && (fVar11 = fVar6, iVar1 < 0x80)) {
      fVar11 = (float)(iVar1 * 0x800000 + 0x3f800000U | uVar29 & 0x807fffff);
    }
    fVar28 = auVar17._0_4_;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),ZEXT416((uint)r),ZEXT416((uint)r));
    auVar16 = vsqrtss_avx(auVar15,auVar15);
    fVar30 = auVar16._0_4_;
    fVar13 = local_18 * fVar30 * 1.442695;
    auVar15 = vroundss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),9);
    fVar13 = fVar13 - auVar15._0_4_;
    auVar17 = vfmadd213ss_fma(auVar34,ZEXT416((uint)fVar13),auVar35);
    auVar17 = vfmadd213ss_avx512f(auVar17,ZEXT416((uint)fVar13),ZEXT416(0x3f321004));
    auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar13),auVar33);
    uVar31 = auVar17._0_4_;
    iVar2 = (int)auVar15._0_4_ + -0x7f + (uVar31 >> 0x17);
    fVar13 = 0.0;
    if ((-0x7f < iVar2) && (fVar13 = fVar6, iVar2 < 0x80)) {
      fVar13 = (float)(iVar2 * 0x800000 + 0x3f800000U | uVar31 & 0x807fffff);
    }
    local_28 = auVar21._0_4_;
    auVar15 = vfmadd132ss_fma(auVar5,auVar33,ZEXT416(local_28));
    fVar8 = 0.0;
    if ((-0x7f < iVar1) && (fVar8 = fVar6, iVar1 < 0x80)) {
      fVar8 = (float)(iVar1 * 0x800000 + 0x3f800000U | uVar29 & 0x807fffff);
    }
    auVar5 = vfmadd132ss_fma(auVar16,auVar33,ZEXT416(local_28));
    fVar12 = 0.0;
    if ((-0x7f < iVar2) && (fVar12 = fVar6, iVar2 < 0x80)) {
      fVar12 = (float)(iVar2 * 0x800000 + 0x3f800000U | uVar31 & 0x807fffff);
    }
    fVar9 = (auVar27._0_4_ + fVar20) * fVar3 * -2.0 * 1.442695;
    auVar16 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
    fVar9 = fVar9 - auVar16._0_4_;
    auVar17 = vfmadd213ss_fma(auVar34,ZEXT416((uint)fVar9),auVar35);
    auVar17 = vfmadd213ss_avx512f(auVar17,ZEXT416((uint)fVar9),ZEXT416(0x3f321004));
    auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)fVar9),auVar33);
    iVar1 = (int)auVar16._0_4_ + -0x7f + (auVar17._0_4_ >> 0x17);
    fVar9 = 0.0;
    if ((-0x7f < iVar1) && (fVar9 = fVar6, iVar1 < 0x80)) {
      fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar17._0_4_ & 0x807fffff);
    }
    iVar10 = iVar10 + 1;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(((auVar15._0_4_ * auVar27._0_4_ * fVar8) /
                                              (fVar20 * fVar20 * fVar20) -
                                             (fVar12 * auVar5._0_4_ * fVar28) /
                                             (fVar30 * fVar30 * fVar30)) * 0.07957747 *
                                            auVar25._0_4_ * 0.5)),
                              ZEXT416((uint)((fVar11 / fVar20 - fVar13 / fVar30) *
                                            (0.07957747 / fVar18))),
                              ZEXT416((uint)(auVar32._0_4_ * 0.25)));
    auVar22 = vfmadd213ss_fma(ZEXT416((uint)((fVar4 / fVar3) * (fVar4 / fVar3) * (1.0 - fVar9))),
                              auVar15,ZEXT416(auVar22._0_4_));
  } while (iVar10 != 100);
  return auVar22._0_4_ / 100.0;
}

Assistant:

Float BeamDiffusionMS(Float sigma_s, Float sigma_a, Float g, Float eta, Float r) {
    const int nSamples = 100;
    Float Ed = 0;
    // Precompute information for dipole integrand
    // Compute reduced scattering coefficients $\sigmaps, \sigmapt$ and albedo $\rhop$
    Float sigmap_s = sigma_s * (1 - g);
    Float sigmap_t = sigma_a + sigmap_s;
    Float rhop = sigmap_s / sigmap_t;

    // Compute non-classical diffusion coefficient $D_\roman{G}$ using Equation
    // $(\ref{eq:diffusion-coefficient-grosjean})$
    Float D_g = (2 * sigma_a + sigmap_s) / (3 * sigmap_t * sigmap_t);

    // Compute effective transport coefficient $\sigmatr$ based on $D_\roman{G}$
    Float sigma_tr = SafeSqrt(sigma_a / D_g);

    // Determine linear extrapolation distance $\depthextrapolation$ using Equation
    // $(\ref{eq:dipole-boundary-condition})$
    Float fm1 = FresnelMoment1(eta), fm2 = FresnelMoment2(eta);
    Float ze = -2 * D_g * (1 + 3 * fm2) / (1 - 2 * fm1);

    // Determine exitance scale factors using Equations $(\ref{eq:kp-exitance-phi})$ and
    // $(\ref{eq:kp-exitance-e})$
    Float cPhi = .25f * (1 - 2 * fm1), cE = .5f * (1 - 3 * fm2);

    for (int i = 0; i < nSamples; ++i) {
        // Sample real point source depth $\depthreal$
        Float zr = -std::log(1 - (i + .5f) / nSamples) / sigmap_t;

        // Evaluate dipole integrand $E_{\roman{d}}$ at $\depthreal$ and add to _Ed_
        Float zv = -zr + 2 * ze;
        Float dr = std::sqrt(r * r + zr * zr), dv = std::sqrt(r * r + zv * zv);
        // Compute dipole fluence rate $\dipole(r)$ using Equation
        // $(\ref{eq:diffusion-dipole})$
        Float phiD =
            Inv4Pi / D_g * (FastExp(-sigma_tr * dr) / dr - FastExp(-sigma_tr * dv) / dv);

        // Compute dipole vector irradiance $-\N{}\cdot\dipoleE(r)$ using Equation
        // $(\ref{eq:diffusion-dipole-vector-irradiance-normal})$
        Float EDn = Inv4Pi *
                    (zr * (1 + sigma_tr * dr) * FastExp(-sigma_tr * dr) / (dr * dr * dr) -
                     zv * (1 + sigma_tr * dv) * FastExp(-sigma_tr * dv) / (dv * dv * dv));

        // Add contribution from dipole for depth $\depthreal$ to _Ed_
        Float E = phiD * cPhi + EDn * cE;
        Float kappa = 1 - FastExp(-2 * sigmap_t * (dr + zr));
        Ed += kappa * rhop * rhop * E;
    }
    return Ed / nSamples;
}